

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcarray.c
# Opt level: O0

LispPTR aref1(LispPTR array,int index)

{
  char cVar1;
  int iVar2;
  uint LAddr;
  LispPTR *pLVar3;
  DLword *pDVar4;
  arrayheader *actarray;
  uint uStack_14;
  short typenumber;
  LispPTR base;
  LispPTR retval;
  int index_local;
  LispPTR array_local;
  
  uStack_14 = 0;
  pLVar3 = NativeAligned4FromLAddr(array);
  if ((int)pLVar3[2] <= index) {
    printf("Invalid index in GC\'s AREF1:  0x%x\n",(ulong)(uint)index);
    printf(" Array size limit:  0x%x\n",(ulong)pLVar3[2]);
    printf(" Array ptr: 0x%x\n",(ulong)array);
    printf(" Array 68K ptr: %p\n",pLVar3);
    printf("base:     0x%x\n",(ulong)(*pLVar3 & 0xfffffff));
    printf("offset:   0x%x\n",(ulong)(ushort)pLVar3[1]);
    printf("type #:   0x%x\n",(ulong)(*(ushort *)((long)pLVar3 + 6) & 0xff));
    printf("fill ptr: 0x%x\n",(ulong)pLVar3[3]);
    error("index out of range in GC\'s AREF1.");
  }
  iVar2 = index + (uint)(ushort)pLVar3[1];
  cVar1 = *(char *)((long)pLVar3 + 6);
  LAddr = *pLVar3 & 0xfffffff;
  if (cVar1 == '\x03') {
    pDVar4 = NativeAligned2FromLAddr(LAddr);
    uStack_14 = *(byte *)((long)pDVar4 + (long)iVar2 ^ 3) | 0xe0000;
  }
  else if (cVar1 == '\x04') {
    pDVar4 = NativeAligned2FromLAddr(LAddr);
    uStack_14 = *(ushort *)((ulong)(pDVar4 + iVar2) ^ 2) | 0xe0000;
  }
  else if (cVar1 == '&') {
    pLVar3 = NativeAligned4FromLAddr(LAddr);
    uStack_14 = pLVar3[iVar2];
  }
  else {
    error("Not Implemented in gc\'s aref1 (other types)");
  }
  return uStack_14;
}

Assistant:

LispPTR aref1(LispPTR array, int index) {
  LispPTR retval = 0;
  LispPTR base;
  short typenumber;
  struct arrayheader *actarray;

  actarray = (struct arrayheader *)NativeAligned4FromLAddr(array);
  if (index >= actarray->totalsize) {
    printf("Invalid index in GC's AREF1:  0x%x\n", index);
    printf(" Array size limit:  0x%x\n", actarray->totalsize);
    printf(" Array ptr: 0x%x\n", array);
    printf(" Array 68K ptr: %p\n", (void *)actarray);
    printf("base:     0x%x\n", actarray->base);
    printf("offset:   0x%x\n", actarray->offset);
    printf("type #:   0x%x\n", actarray->typenumber);
    printf("fill ptr: 0x%x\n", actarray->fillpointer);
    error("index out of range in GC's AREF1.");
  }
  index += actarray->offset;
  typenumber = actarray->typenumber;
  base = actarray->base;
  switch (typenumber) {
    case 3: /* unsigned 8bits */
      retval = (GETBYTE(((char *)NativeAligned2FromLAddr(base)) + index)) & 0x0ff;
      retval |= S_POSITIVE;
      break;
    case 4: /* unsigned 16bits */
      retval = (GETWORD(((DLword *)NativeAligned2FromLAddr(base)) + index)) & 0x0ffff;
      retval |= S_POSITIVE;
      break;
    case 38: retval = (*(((LispPTR *)NativeAligned4FromLAddr(base)) + index)); break;
    default: error("Not Implemented in gc's aref1 (other types)");
  }
  return (retval);
}